

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeKernelSetCacheConfig(ze_kernel_handle_t hKernel,ze_cache_config_flags_t flags)

{
  ze_pfnKernelSetCacheConfig_t pfnSetCacheConfig;
  ze_result_t result;
  ze_cache_config_flags_t flags_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnSetCacheConfig._0_4_ = ZE_RESULT_SUCCESS;
  if (_DAT_0011c698 != (code *)0x0) {
    pfnSetCacheConfig._0_4_ = (*_DAT_0011c698)(hKernel,flags);
  }
  return (ze_result_t)pfnSetCacheConfig;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetCacheConfig(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_cache_config_flags_t flags                   ///< [in] cache configuration.
                                                        ///< must be 0 (default configuration) or a valid combination of ::ze_cache_config_flag_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetCacheConfig = context.zeDdiTable.Kernel.pfnSetCacheConfig;
        if( nullptr != pfnSetCacheConfig )
        {
            result = pfnSetCacheConfig( hKernel, flags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }